

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<512U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::gcd<512u,unsigned_int,void,false>
          (uintwide_t<512U,_unsigned_int,_void,_false> *__return_storage_ptr__,wide_integer *this,
          uintwide_t<512U,_unsigned_int,_void,_false> *a,
          uintwide_t<512U,_unsigned_int,_void,_false> *b)

{
  uint *puVar1;
  value_type_conflict *pvVar2;
  int *piVar3;
  int *piVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  enable_if_t<std::is_integral<unsigned_long>::value,_bool> eVar23;
  unsigned_long vr;
  unsigned_fast_type uVar24;
  unsigned_fast_type n;
  long lVar25;
  bool bVar26;
  reverse_iterator<const_unsigned_int_*> pb;
  undefined1 *puVar27;
  long lVar28;
  value_type_conflict *pvVar29;
  ulong uVar30;
  unsigned_fast_type n_00;
  local_wide_integer_type u;
  local_wide_integer_type v;
  uintwide_t<512U,_unsigned_int,_void,_false> local_138;
  uintwide_t<512U,_unsigned_int,_void,_false> local_f8;
  uintwide_t<512U,_unsigned_int,_void,_false> local_b8;
  undefined1 local_78 [72];
  
  uVar5 = *(unsigned_long *)this;
  local_f8.values.super_array<unsigned_int,_16UL>.elems._48_8_ = *(undefined8 *)(this + 0x30);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._56_8_ = *(undefined8 *)(this + 0x38);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._32_8_ = *(undefined8 *)(this + 0x20);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._40_8_ = *(undefined8 *)(this + 0x28);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_f8.values.super_array<unsigned_int,_16UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0] = (int)uVar5;
  local_f8.values.super_array<unsigned_int,_16UL>.elems[1] = (int)(uVar5 >> 0x20);
  uVar7 = local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_;
  local_f8.values.super_array<unsigned_int,_16UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  uVar6 = *(unsigned_long *)(a->values).super_array<unsigned_int,_16UL>.elems;
  local_b8.values.super_array<unsigned_int,_16UL>.elems._48_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 0xc);
  local_b8.values.super_array<unsigned_int,_16UL>.elems._56_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 0xe);
  local_b8.values.super_array<unsigned_int,_16UL>.elems._32_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 8);
  local_b8.values.super_array<unsigned_int,_16UL>.elems._40_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 10);
  local_b8.values.super_array<unsigned_int,_16UL>.elems._16_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 4);
  local_b8.values.super_array<unsigned_int,_16UL>.elems._24_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 6);
  local_b8.values.super_array<unsigned_int,_16UL>.elems[0] = (int)uVar6;
  local_b8.values.super_array<unsigned_int,_16UL>.elems[1] = (int)(uVar6 >> 0x20);
  uVar9 = local_b8.values.super_array<unsigned_int,_16UL>.elems._0_8_;
  local_b8.values.super_array<unsigned_int,_16UL>.elems._8_8_ =
       *(undefined8 *)((a->values).super_array<unsigned_int,_16UL>.elems + 2);
  lVar25 = 0x3c;
  do {
    if (lVar25 == -4) goto LAB_001ad4bf;
    piVar3 = (int *)((long)local_f8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    piVar4 = (int *)((long)local_b8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    lVar25 = lVar25 + -4;
  } while (*piVar3 == *piVar4);
  local_b8.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)uVar6;
  if (local_b8.values.super_array<unsigned_int,_16UL>.elems[0] == 0) {
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    lVar25 = 0x3c;
    do {
      if (lVar25 == -4) goto LAB_001ad4bf;
      piVar4 = (int *)((long)local_b8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      piVar3 = (int *)((long)local_138.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      lVar25 = lVar25 + -4;
    } while (*piVar4 == *piVar3);
  }
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)uVar5;
  if (local_f8.values.super_array<unsigned_int,_16UL>.elems[0] == 0) {
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
    local_138.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    lVar25 = 0x3c;
    do {
      if (lVar25 == -4) {
        local_138.values.super_array<unsigned_int,_16UL>.elems[0] =
             (a->values).super_array<unsigned_int,_16UL>.elems[0];
        local_138.values.super_array<unsigned_int,_16UL>.elems[1] =
             (a->values).super_array<unsigned_int,_16UL>.elems[1];
        local_138.values.super_array<unsigned_int,_16UL>.elems[2] =
             (a->values).super_array<unsigned_int,_16UL>.elems[2];
        local_138.values.super_array<unsigned_int,_16UL>.elems[3] =
             (a->values).super_array<unsigned_int,_16UL>.elems[3];
        local_138.values.super_array<unsigned_int,_16UL>.elems[4] =
             (a->values).super_array<unsigned_int,_16UL>.elems[4];
        local_138.values.super_array<unsigned_int,_16UL>.elems[5] =
             (a->values).super_array<unsigned_int,_16UL>.elems[5];
        local_138.values.super_array<unsigned_int,_16UL>.elems[6] =
             (a->values).super_array<unsigned_int,_16UL>.elems[6];
        local_138.values.super_array<unsigned_int,_16UL>.elems[7] =
             (a->values).super_array<unsigned_int,_16UL>.elems[7];
        local_138.values.super_array<unsigned_int,_16UL>.elems[8] =
             (a->values).super_array<unsigned_int,_16UL>.elems[8];
        local_138.values.super_array<unsigned_int,_16UL>.elems[9] =
             (a->values).super_array<unsigned_int,_16UL>.elems[9];
        local_138.values.super_array<unsigned_int,_16UL>.elems[10] =
             (a->values).super_array<unsigned_int,_16UL>.elems[10];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] =
             (a->values).super_array<unsigned_int,_16UL>.elems[0xb];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] =
             (a->values).super_array<unsigned_int,_16UL>.elems[0xc];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] =
             (a->values).super_array<unsigned_int,_16UL>.elems[0xd];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] =
             (a->values).super_array<unsigned_int,_16UL>.elems[0xe];
        local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] =
             (a->values).super_array<unsigned_int,_16UL>.elems[0xf];
        goto LAB_001ad78d;
      }
      piVar4 = (int *)((long)local_f8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      piVar3 = (int *)((long)local_138.values.super_array<unsigned_int,_16UL>.elems + lVar25);
      lVar25 = lVar25 + -4;
    } while (*piVar4 == *piVar3);
  }
  local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_ = uVar7;
  local_b8.values.super_array<unsigned_int,_16UL>.elems._0_8_ = uVar9;
  uVar24 = lsb<512u,unsigned_int,void,false>(&local_f8);
  n = lsb<512u,unsigned_int,void,false>(&local_b8);
  n_00 = uVar24;
  if (n < uVar24) {
    n_00 = n;
  }
  if (uVar24 != 0) {
    if ((uVar24 & 0xfffffe00) == 0) {
      uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_f8,uVar24);
    }
    else {
      local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
      local_f8.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    }
  }
  if (n != 0) {
    if ((n & 0xfffffe00) == 0) {
      uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_b8,n);
    }
    else {
      local_b8.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
      local_b8.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    }
  }
  puVar27 = local_78;
  pvVar29 = (value_type_conflict *)&local_b8;
LAB_001ad548:
  uVar21 = local_f8.values.super_array<unsigned_int,_16UL>.elems._56_8_;
  uVar19 = local_f8.values.super_array<unsigned_int,_16UL>.elems._48_8_;
  uVar17 = local_f8.values.super_array<unsigned_int,_16UL>.elems._40_8_;
  uVar15 = local_f8.values.super_array<unsigned_int,_16UL>.elems._32_8_;
  uVar13 = local_f8.values.super_array<unsigned_int,_16UL>.elems._24_8_;
  uVar11 = local_f8.values.super_array<unsigned_int,_16UL>.elems._16_8_;
  uVar9 = local_f8.values.super_array<unsigned_int,_16UL>.elems._8_8_;
  uVar7 = local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_;
  if ((uintwide_t<512U,_unsigned_int,_void,_false> *)pvVar29 != &local_f8) goto code_r0x001ad552;
  goto LAB_001ad5cf;
LAB_001ad4bf:
  local_138.values.super_array<unsigned_int,_16UL>.elems[0] = *(value_type_conflict *)this;
  local_138.values.super_array<unsigned_int,_16UL>.elems[1] = *(value_type_conflict *)(this + 4);
  local_138.values.super_array<unsigned_int,_16UL>.elems[2] = *(value_type_conflict *)(this + 8);
  local_138.values.super_array<unsigned_int,_16UL>.elems[3] = *(value_type_conflict *)(this + 0xc);
  local_138.values.super_array<unsigned_int,_16UL>.elems[4] = *(value_type_conflict *)(this + 0x10);
  local_138.values.super_array<unsigned_int,_16UL>.elems[5] = *(value_type_conflict *)(this + 0x14);
  local_138.values.super_array<unsigned_int,_16UL>.elems[6] = *(value_type_conflict *)(this + 0x18);
  local_138.values.super_array<unsigned_int,_16UL>.elems[7] = *(value_type_conflict *)(this + 0x1c);
  local_138.values.super_array<unsigned_int,_16UL>.elems[8] = *(value_type_conflict *)(this + 0x20);
  local_138.values.super_array<unsigned_int,_16UL>.elems[9] = *(value_type_conflict *)(this + 0x24);
  local_138.values.super_array<unsigned_int,_16UL>.elems[10] = *(value_type_conflict *)(this + 0x28)
  ;
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] =
       *(value_type_conflict *)(this + 0x2c);
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] =
       *(value_type_conflict *)(this + 0x30);
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] =
       *(value_type_conflict *)(this + 0x34);
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] =
       *(value_type_conflict *)(this + 0x38);
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] =
       *(value_type_conflict *)(this + 0x3c);
  goto LAB_001ad78d;
code_r0x001ad552:
  puVar1 = (uint *)(puVar27 + -4);
  pvVar2 = pvVar29 + -1;
  puVar27 = puVar27 + -4;
  pvVar29 = pvVar29 + -1;
  if (*pvVar2 == *puVar1) goto LAB_001ad548;
  if (*puVar1 < *pvVar2) {
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[0];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[1] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[1];
    uVar8 = local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[2] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[2];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[3] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[3];
    uVar10 = local_f8.values.super_array<unsigned_int,_16UL>.elems._8_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[4] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[4];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[5] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[5];
    uVar12 = local_f8.values.super_array<unsigned_int,_16UL>.elems._16_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[6] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[6];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[7] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[7];
    uVar14 = local_f8.values.super_array<unsigned_int,_16UL>.elems._24_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[8] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[8];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[9] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[9];
    uVar16 = local_f8.values.super_array<unsigned_int,_16UL>.elems._32_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[10] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[10];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[0xb];
    uVar18 = local_f8.values.super_array<unsigned_int,_16UL>.elems._40_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[0xc];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[0xd];
    uVar20 = local_f8.values.super_array<unsigned_int,_16UL>.elems._48_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[0xe];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf] =
         local_b8.values.super_array<unsigned_int,_16UL>.elems[0xf];
    uVar22 = local_f8.values.super_array<unsigned_int,_16UL>.elems._56_8_;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0] = (value_type_conflict)uVar7;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[1] = SUB84(uVar7,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[0] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[0];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[1] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[1];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[2] = (value_type_conflict)uVar9;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[3] = SUB84(uVar9,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[2] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[2];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[3] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[3];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[4] = (value_type_conflict)uVar11;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[5] = SUB84(uVar11,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[4] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[4];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[5] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[5];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[6] = (value_type_conflict)uVar13;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[7] = SUB84(uVar13,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[6] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[6];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[7] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[7];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[8] = (value_type_conflict)uVar15;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[9] = SUB84(uVar15,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[8] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[8];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[9] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[9];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[10] = (value_type_conflict)uVar17;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb] = SUB84(uVar17,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[10] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[10];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[0xb] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc] = (value_type_conflict)uVar19;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd] = SUB84(uVar19,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[0xc] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[0xd] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd];
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe] = (value_type_conflict)uVar21;
    local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf] = SUB84(uVar21,4);
    local_b8.values.super_array<unsigned_int,_16UL>.elems[0xe] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe];
    local_b8.values.super_array<unsigned_int,_16UL>.elems[0xf] =
         local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf];
    local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_ = uVar8;
    local_f8.values.super_array<unsigned_int,_16UL>.elems._8_8_ = uVar10;
    local_f8.values.super_array<unsigned_int,_16UL>.elems._16_8_ = uVar12;
    local_f8.values.super_array<unsigned_int,_16UL>.elems._24_8_ = uVar14;
    local_f8.values.super_array<unsigned_int,_16UL>.elems._32_8_ = uVar16;
    local_f8.values.super_array<unsigned_int,_16UL>.elems._40_8_ = uVar18;
    local_f8.values.super_array<unsigned_int,_16UL>.elems._48_8_ = uVar20;
    local_f8.values.super_array<unsigned_int,_16UL>.elems._56_8_ = uVar22;
  }
LAB_001ad5cf:
  lVar25 = 0x3c;
  do {
    if (lVar25 == -4) goto LAB_001ad722;
    piVar3 = (int *)((long)local_f8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    piVar4 = (int *)((long)local_b8.values.super_array<unsigned_int,_16UL>.elems + lVar25);
    lVar25 = lVar25 + -4;
  } while (*piVar3 == *piVar4);
  local_138.values.super_array<unsigned_int,_16UL>.elems[0] = 0xffffffff;
  local_138.values.super_array<unsigned_int,_16UL>.elems[1] = 0xffffffff;
  eVar23 = operator<=(&local_b8,(unsigned_long *)&local_138);
  if (!eVar23) {
    lVar25 = 0;
    bVar26 = false;
    do {
      uVar30 = ((ulong)local_b8.values.super_array<unsigned_int,_16UL>.elems[lVar25] - (ulong)bVar26
               ) - (ulong)local_f8.values.super_array<unsigned_int,_16UL>.elems[lVar25];
      local_b8.values.super_array<unsigned_int,_16UL>.elems[lVar25] = (value_type_conflict)uVar30;
      bVar26 = uVar30 >> 0x20 != 0;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x10);
    uVar24 = lsb<512u,unsigned_int,void,false>(&local_b8);
    puVar27 = local_78;
    pvVar29 = (value_type_conflict *)&local_b8;
    if (uVar24 != 0) {
      if ((uVar24 & 0xfffffe00) == 0) {
        uintwide_t<512U,_unsigned_int,_void,_false>::shr<unsigned_long>(&local_b8,uVar24);
      }
      else {
        local_b8.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
        local_b8.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
      }
    }
    goto LAB_001ad548;
  }
  uVar30 = std::__detail::__gcd<unsigned_long>
                     (local_b8.values.super_array<unsigned_int,_16UL>.elems._0_8_,
                      local_f8.values.super_array<unsigned_int,_16UL>.elems._0_8_);
  local_138.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
  lVar25 = 0;
  if (uVar30 == 0) {
LAB_001ad6e0:
    memset((void *)((long)local_138.values.super_array<unsigned_int,_16UL>.elems + lVar25),0,
           0x40 - lVar25);
  }
  else {
    do {
      lVar28 = lVar25;
      *(int *)((long)local_138.values.super_array<unsigned_int,_16UL>.elems + lVar28) = (int)uVar30;
      lVar25 = lVar28 + 4;
      uVar30 = uVar30 >> 0x20;
      if (uVar30 == 0) break;
    } while (lVar28 != 0x3c);
    if (lVar28 != 0x3c) goto LAB_001ad6e0;
  }
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xc];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xd];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xe];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xf];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[8] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[8];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[9] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[9];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[10] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[10];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xb];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[4] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[4];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[5] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[5];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[6] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[6];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[7] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[7];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[0] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[1] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[1];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[2] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[2];
  local_f8.values.super_array<unsigned_int,_16UL>.elems[3] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[3];
LAB_001ad722:
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[0xc];
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[0xd];
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[0xe];
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[0xf];
  local_138.values.super_array<unsigned_int,_16UL>.elems[8] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[8];
  local_138.values.super_array<unsigned_int,_16UL>.elems[9] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[9];
  local_138.values.super_array<unsigned_int,_16UL>.elems[10] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[10];
  local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[0xb];
  local_138.values.super_array<unsigned_int,_16UL>.elems[4] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[4];
  local_138.values.super_array<unsigned_int,_16UL>.elems[5] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[5];
  local_138.values.super_array<unsigned_int,_16UL>.elems[6] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[6];
  local_138.values.super_array<unsigned_int,_16UL>.elems[7] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[7];
  local_138.values.super_array<unsigned_int,_16UL>.elems[0] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[0];
  local_138.values.super_array<unsigned_int,_16UL>.elems[1] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[1];
  local_138.values.super_array<unsigned_int,_16UL>.elems[2] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[2];
  local_138.values.super_array<unsigned_int,_16UL>.elems[3] =
       local_f8.values.super_array<unsigned_int,_16UL>.elems[3];
  if (n_00 != 0) {
    if ((n_00 & 0xfffffe00) == 0) {
      uintwide_t<512U,_unsigned_int,_void,_false>::shl<unsigned_long>(&local_138,n_00);
    }
    else {
      local_138.values.super_array<unsigned_int,_16UL>.elems[0xc] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[0xd] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[0xe] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[0xf] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[8] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[9] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[10] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[0xb] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[4] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[5] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[6] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[7] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[0] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[1] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[2] = 0;
      local_138.values.super_array<unsigned_int,_16UL>.elems[3] = 0;
    }
  }
LAB_001ad78d:
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xc] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xc];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xd] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xd];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xe] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xe];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xf] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xf];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[8] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[8];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[9] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[9];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[10] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[10];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0xb] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0xb];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[4] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[4];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[5] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[5];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[6] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[6];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[7] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[7];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[0] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[0];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[1] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[1];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[2] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[2];
  (__return_storage_ptr__->values).super_array<unsigned_int,_16UL>.elems[3] =
       local_138.values.super_array<unsigned_int,_16UL>.elems[3];
  return __return_storage_ptr__;
}

Assistant:

constexpr auto gcd(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& a, // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
                     const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // This implementation of GCD is an adaptation
    // of existing code from Boost.Multiprecision.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_ushort_type       = typename local_wide_integer_type::limb_type;
    using local_ularge_type       = typename local_wide_integer_type::double_limb_type;

    const auto u_is_neg = local_wide_integer_type::is_neg(a);
    const auto v_is_neg = local_wide_integer_type::is_neg(b);

    local_wide_integer_type u((!u_is_neg) ? a : -a);
    local_wide_integer_type v((!v_is_neg) ? b : -b);

    local_wide_integer_type result;

    using local_size_type = typename local_wide_integer_type::representation_type::size_type;

    if(u == v)
    { // NOLINT(bugprone-branch-clone)
      // This handles cases having (u = v) and also (u = v = 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(v) == static_cast<local_ushort_type>(UINT8_C(0))) && (v == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (v = 0) with (u != 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(u) == static_cast<local_ushort_type>(UINT8_C(0))) && (u == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (u = 0) with (v != 0).
      result = std::move(v); // LCOV_EXCL_LINE
    }
    else
    {
      // Now we handle cases having (u != 0) and (v != 0).

      // Let shift := lg K, where K is the greatest
      // power of 2 dividing both u and v.

      const unsigned_fast_type u_shift = lsb(u);
      const unsigned_fast_type v_shift = lsb(v);

      const unsigned_fast_type left_shift_amount = (detail::min_unsafe)(u_shift, v_shift);

      u >>= u_shift;
      v >>= v_shift;

      for(;;)
      {
        // Now u and v are both odd, so diff(u, v) is even.
        // Let u = min(u, v), v = diff(u, v) / 2.

        if(u > v)
        {
          swap(u, v);
        }

        if(u == v)
        {
          break;
        }

        if(v <= (std::numeric_limits<local_ularge_type>::max)())
        {
          const auto my_v_hi =
            static_cast<local_ushort_type>
            (
              (v.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(v.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const auto my_u_hi =
            static_cast<local_ushort_type>
            (
              (u.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(u.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const local_ularge_type v_large = detail::make_large(*v.crepresentation().cbegin(), my_v_hi);
          const local_ularge_type u_large = detail::make_large(*u.crepresentation().cbegin(), my_u_hi);

          u = detail::integer_gcd_reduce(v_large, u_large);

          break;
        }

        v  -= u;
        v >>= lsb(v);
      }

      result = (u << left_shift_amount);
    }
   
    if(u_is_neg != v_is_neg)
    {
      result.negate();
    }

    return result;
  }